

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

void Js::JavascriptExceptionOperators::WalkStackForExceptionContext
               (ScriptContext *scriptContext,JavascriptExceptionContext *exceptionContext,
               Var thrownObject,uint64 stackCrawlLimit,PVOID returnAddress,bool isThrownException,
               bool resetSatck)

{
  JavascriptFunction *function;
  uint32 local_1c [2];
  uint32 callerBytecodeOffset;
  
  function = WalkStackForExceptionContextInternal
                       (scriptContext,exceptionContext,thrownObject,local_1c,stackCrawlLimit,
                        returnAddress,isThrownException,resetSatck);
  if (function != (JavascriptFunction *)0x0) {
    JavascriptExceptionContext::SetThrowingFunction
              (exceptionContext,function,local_1c[0],returnAddress);
    return;
  }
  return;
}

Assistant:

void
        JavascriptExceptionOperators::WalkStackForExceptionContext(ScriptContext& scriptContext, JavascriptExceptionContext& exceptionContext, Var thrownObject, uint64 stackCrawlLimit, PVOID returnAddress, bool isThrownException, bool resetSatck)
    {
        uint32 callerBytecodeOffset;
        JavascriptFunction * jsFunc = WalkStackForExceptionContextInternal(scriptContext, exceptionContext, thrownObject, callerBytecodeOffset, stackCrawlLimit, returnAddress, isThrownException, resetSatck);

        if (jsFunc)
        {
            // If found, the caller is a function, and we can retrieve the debugger info from there
            // otherwise it's probably just accessing property. While it is still possible to throw
            // from that context, we just won't be able to get the line number etc., which make sense.
            exceptionContext.SetThrowingFunction(jsFunc, callerBytecodeOffset, returnAddress);
        }
    }